

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::simplifyDB(Engine *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = 0;
  iVar3 = 0;
  if ((this->propagators).sz != 0) {
    uVar4 = 0;
    iVar3 = 0;
    do {
      iVar2 = (*(this->propagators).data[uVar4]->_vptr_Propagator[7])();
      iVar3 = iVar3 + iVar2;
      uVar4 = uVar4 + 1;
      uVar1 = (this->propagators).sz;
    } while (uVar4 < uVar1);
    iVar3 = uVar1 + iVar3;
  }
  if ((this->vars).sz != 0) {
    uVar4 = 0;
    do {
      iVar2 = IntVar::simplifyWatches((this->vars).data[uVar4]);
      iVar3 = iVar3 + iVar2;
      uVar4 = uVar4 + 1;
      uVar5 = (this->vars).sz;
    } while (uVar4 < uVar5);
  }
  this->next_simp_db = (long)(int)((iVar3 + uVar5) * 10) + this->propagations;
  return;
}

Assistant:

void Engine::simplifyDB() {
	int cost = 0;
	for (unsigned int i = 0; i < propagators.size(); i++) {
		cost += propagators[i]->checkSatisfied();
	}
	cost += propagators.size();
	for (unsigned int i = 0; i < vars.size(); i++) {
		cost += vars[i]->simplifyWatches();
	}
	cost += vars.size();
	cost *= 10;
	//  printf("simp db cost: %d\n", cost);
	next_simp_db = propagations + cost;
}